

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O1

void Gia_ManCofOneDerive_rec(Ccf_Man_t *p,int Id)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (-1 < Id) {
    if (Id < p->vCopies->nSize) {
      if (p->vCopies->pArray[(uint)Id] == -1) {
        iVar1 = p->pFrames->nObjs;
        if (iVar1 <= Id) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar2 = *(ulong *)(p->pFrames->pObjs + (uint)Id);
        uVar4 = (uint)uVar2;
        if (((~uVar4 & 0x9fffffff) != 0) &&
           (((int)uVar4 < 0 || ((uVar4 & 0x1fffffff) == 0x1fffffff)))) {
          __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCCof.c"
                        ,0xa0,"void Gia_ManCofOneDerive_rec(Ccf_Man_t *, int)");
        }
        uVar6 = (uint)(uVar2 >> 0x20);
        if ((~uVar4 & 0x1fffffff) == 0 || (int)uVar4 < 0) {
          if (-1 < (int)uVar4) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ac,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          if ((int)(uVar6 & 0x1fffffff) < p->pGia->nRegs) {
            uVar4 = Id * 2;
          }
          else {
            if (p->pSat->size <= Id) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                            ,0xcd,"int sat_solver_var_value(sat_solver *, int)");
            }
            uVar4 = (uint)(p->pSat->model[(uint)Id] == 1);
          }
        }
        else {
          if (iVar1 <= Id) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar5 = Id - (uVar6 & 0x1fffffff);
          Gia_ManCofOneDerive_rec(p,Id - (uVar4 & 0x1fffffff));
          Gia_ManCofOneDerive_rec(p,uVar5);
          uVar4 = Id - (uVar4 & 0x1fffffff);
          if ((int)uVar4 < 0) goto LAB_00659ccf;
          iVar1 = p->vCopies->nSize;
          if (iVar1 <= (int)uVar4) goto LAB_00659ccf;
          piVar3 = p->vCopies->pArray;
          uVar4 = piVar3[uVar4];
          if ((int)uVar4 < 0) {
LAB_00659d2c:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10f,"int Abc_LitNotCond(int, int)");
          }
          if (((int)uVar5 < 0) || (iVar1 <= (int)uVar5)) goto LAB_00659ccf;
          uVar5 = piVar3[uVar5];
          if ((int)uVar5 < 0) goto LAB_00659d2c;
          uVar4 = Gia_ManHashAnd(p->pFrames,uVar4 ^ (uint)(uVar2 >> 0x1d) & 1,
                                 uVar5 ^ uVar6 >> 0x1d & 1);
        }
        if (p->vCopies->nSize <= Id) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vCopies->pArray[(uint)Id] = uVar4;
      }
      return;
    }
  }
LAB_00659ccf:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManCofOneDerive_rec( Ccf_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    int Res;
    if ( Vec_IntEntry(p->vCopies, Id) != -1 )
        return;
    pObj = Gia_ManObj(p->pFrames, Id);
    assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsAnd(pObj) )
    {
        int fCompl0 = Gia_ObjFaninC0(pObj);
        int fCompl1 = Gia_ObjFaninC1(pObj);
        int Fan0 = Gia_ObjFaninId0p(p->pFrames, pObj);
        int Fan1 = Gia_ObjFaninId1p(p->pFrames, pObj);
        Gia_ManCofOneDerive_rec( p, Fan0 );
        Gia_ManCofOneDerive_rec( p, Fan1 );
        Res = Gia_ManHashAnd( p->pFrames, 
            Gia_Obj0Copy(p->vCopies, Fan0, fCompl0), 
            Gia_Obj1Copy(p->vCopies, Fan1, fCompl1) );
    }
    else if ( Gia_ObjCioId(pObj) >= Gia_ManRegNum(p->pGia) ) // PI
        Res = sat_solver_var_value( p->pSat, Id );
    else
        Res = Abc_Var2Lit( Id, 0 );
    Vec_IntWriteEntry( p->vCopies, Id, Res );
}